

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

Vector<int,_std::allocator<int>_> * __thiscall
amrex::AmrLevel::getBCArray(AmrLevel *this,int State_Type,int gridno,int strt_comp,int ncomp)

{
  int *piVar1;
  Vector<int,_std::allocator<int>_> *in_RDI;
  int in_R9D;
  int m;
  int *b_rec;
  int n;
  BCRec bcr;
  Vector<int,_std::allocator<int>_> *bc;
  size_type in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int local_7c;
  int local_70 [4];
  int local_60;
  int local_58;
  int local_54;
  int i;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  
  std::allocator<int>::allocator((allocator<int> *)0x139f3ce);
  Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
             ,(allocator_type *)0x139f3e2);
  std::allocator<int>::~allocator((allocator<int> *)0x139f3f1);
  BCRec::BCRec((BCRec *)&local_54);
  for (local_58 = 0; local_58 < in_R9D; local_58 = local_58 + 1) {
    Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    StateData::getBC((StateData *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffb4,i);
    _local_54 = local_70._0_8_;
    in_stack_ffffffffffffffb4 = (int)local_70._8_8_;
    in_stack_ffffffffffffffb8 = SUB84(local_70._8_8_,4);
    in_stack_ffffffffffffffbc = local_60;
    for (local_7c = 0; local_7c < 6; local_7c = local_7c + 1) {
      in_stack_ffffffffffffff54 = (&local_54)[local_7c];
      piVar1 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff48);
      *piVar1 = in_stack_ffffffffffffff54;
    }
  }
  return in_RDI;
}

Assistant:

Vector<int>
AmrLevel::getBCArray (int State_Type,
                      int gridno,
                      int strt_comp,
                      int ncomp)
{
    Vector<int> bc(2*AMREX_SPACEDIM*ncomp);

    BCRec bcr;

    for (int n = 0; n < ncomp; n++)
    {
        bcr = state[State_Type].getBC(strt_comp+n,gridno);
        const int* b_rec = bcr.vect();
        for (int m = 0; m < 2*AMREX_SPACEDIM; m++)
            bc[2*AMREX_SPACEDIM*n + m] = b_rec[m];
    }

    return bc;
}